

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  file_format_t fVar4;
  CmdLine *pCVar5;
  exception_t<cfgfile::string_trait_t> *this;
  allocator local_831;
  String local_830;
  String local_810;
  String local_7f0;
  size_type __dnew;
  size_type local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  String local_7b0;
  size_type __dnew_1;
  size_type local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  String local_770;
  String local_750;
  String local_730;
  for_generation_t data;
  determine_format_t<cfgfile::string_trait_t> d;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0 [15];
  model_t model;
  ofstream out;
  _Alloc_hider local_4d8;
  CmdLine *local_4d0;
  undefined1 local_4c8 [16];
  pointer local_4b8;
  iterator iStack_4b0;
  pointer local_4a8;
  pointer puStack_4a0;
  tag_t<cfgfile::string_trait_t> *local_498;
  Command *pCStack_490;
  Command *local_488;
  _Alloc_hider _Stack_480;
  pointer local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_470;
  pointer local_460;
  pointer pbStack_458;
  _Alloc_hider local_450;
  _Alloc_hider local_448;
  undefined1 local_440 [88];
  ios_base local_3e8 [432];
  ifstream in;
  size_type local_230;
  int aiStack_218 [2];
  size_type local_210;
  
  data.m_input_file_name._M_dataplus._M_p = (pointer)&data.m_input_file_name.field_2;
  data.m_input_file_name._M_string_length = 0;
  data.m_input_file_name.field_2._M_local_buf[0] = '\0';
  data.m_output_file_name._M_dataplus._M_p = (pointer)&data.m_output_file_name.field_2;
  data.m_output_file_name._M_string_length = 0;
  data.m_output_file_name.field_2._M_local_buf[0] = '\0';
  local_4d8._M_p = (pointer)&out;
  _out = &PTR__CmdLine_0013ecc8;
  local_460 = (pointer)0x0;
  pbStack_458 = (pointer)0x0;
  local_450._M_p = (pointer)0x0;
  local_448._M_p = local_440 + 8;
  local_4c8._0_8_ = (pointer)0x0;
  local_4c8._8_8_ = (pointer)0x0;
  local_4b8 = (pointer)0x0;
  iStack_4b0._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_4a8 = (pointer)0x0;
  puStack_4a0 = (pointer)0x0;
  local_498 = (tag_t<cfgfile::string_trait_t> *)0x0;
  pCStack_490 = (Command *)0x0;
  local_488 = (Command *)0x0;
  _Stack_480._M_p = (pointer)0x0;
  local_478 = (pointer)0x0;
  aStack_470._M_allocated_capacity = 0;
  aStack_470._8_4_ = 0;
  local_440._0_8_ = 0;
  local_440[8] = '\0';
  d.m_stream = (istream_t *)local_6c0;
  local_6c0[0]._M_allocated_capacity._0_7_ = 0x66207475706e49;
  local_6c0[0]._M_local_buf[7] = 'i';
  local_6c0[0]._8_7_ = 0x656d616e20656c;
  local_6c0[0]._M_local_buf[0xf] = '\0';
  model.m_root.m_name._M_dataplus._M_p = (pointer)&model.m_root.m_name.field_2;
  model.m_root.m_name._M_string_length = 0;
  model.m_root.m_name.field_2._M_local_buf[0] = '\0';
  local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
  local_830._M_string_length = 0;
  local_830.field_2._M_local_buf[0] = '\0';
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  local_810._M_string_length = 0;
  local_810.field_2._M_local_buf[0] = '\0';
  local_4d0 = (CmdLine *)local_4d8._M_p;
  pCVar5 = Args::details::
           API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
           ::addArgWithFlagAndName<char_const(&)[6]>
                     ((API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
                       *)local_4d8._M_p,'i',(char (*) [6])"input",true,true,(String *)&d,
                      (String *)&model,&local_830,&local_810);
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  __dnew = 0x10;
  local_7f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7f0,(ulong)&__dnew);
  local_7f0.field_2._M_allocated_capacity = __dnew;
  builtin_strncpy(local_7f0._M_dataplus._M_p,"Output file name",0x10);
  local_7f0._M_string_length = __dnew;
  local_7f0._M_dataplus._M_p[__dnew] = '\0';
  local_7c8 = 0;
  local_7c0._M_local_buf[0] = '\0';
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  local_7b0._M_string_length = 0;
  local_7b0.field_2._M_allocated_capacity =
       local_7b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_730._M_string_length = 0;
  local_730.field_2._M_local_buf[0] = '\0';
  __dnew = (size_type)&local_7c0;
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  pCVar5 = Args::details::
           API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
           ::addArgWithFlagAndName<char_const(&)[7]>
                     ((API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
                       *)pCVar5,'o',(char (*) [7])"output",true,true,&local_7f0,(String *)&__dnew,
                      &local_7b0,&local_730);
  std::__cxx11::string::string((string *)&local_750,*argv,&local_831);
  __dnew_1 = 0x21;
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  local_770._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_770,(ulong)&__dnew_1);
  local_770.field_2._M_allocated_capacity = __dnew_1;
  builtin_strncpy(local_770._M_dataplus._M_p,"C++ header generator for cfgfile.",0x21);
  local_770._M_string_length = __dnew_1;
  local_770._M_dataplus._M_p[__dnew_1] = '\0';
  local_788 = 0;
  local_780._M_local_buf[0] = '\0';
  __dnew_1 = (size_type)&local_780;
  Args::CmdLine::addHelp(pCVar5,true,&local_750,&local_770,0x4f,(String *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_780) {
    operator_delete((void *)__dnew_1,
                    CONCAT71(local_780._M_allocated_capacity._1_7_,local_780._M_local_buf[0]) + 1);
  }
  paVar1 = &local_810.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,
                    CONCAT71(local_730.field_2._M_allocated_capacity._1_7_,
                             local_730.field_2._M_local_buf[0]) + 1);
  }
  paVar2 = &model.m_root.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != &local_7c0) {
    operator_delete((void *)__dnew,
                    CONCAT71(local_7c0._M_allocated_capacity._1_7_,local_7c0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != paVar1) {
    operator_delete(local_810._M_dataplus._M_p,
                    CONCAT53(local_810.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_810.field_2._M_local_buf[2],
                                      CONCAT11(local_810.field_2._M_local_buf[1],
                                               local_810.field_2._M_local_buf[0]))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p,
                    CONCAT71(local_830.field_2._M_allocated_capacity._1_7_,
                             local_830.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)model.m_root.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(model.m_root.m_name._M_dataplus._M_p,
                    CONCAT53(model.m_root.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(model.m_root.m_name.field_2._M_local_buf[2],
                                      CONCAT11(model.m_root.m_name.field_2._M_local_buf[1],
                                               model.m_root.m_name.field_2._M_local_buf[0]))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)d.m_stream != local_6c0) {
    operator_delete(d.m_stream,
                    CONCAT17(local_6c0[0]._M_local_buf[7],
                             (undefined7)local_6c0[0]._M_allocated_capacity) + 1);
  }
  Args::CmdLine::parse((CmdLine *)&out,argc,argv);
  model.m_root.m_name.field_2._M_local_buf[0] = '-';
  model.m_root.m_name.field_2._M_local_buf[1] = 'i';
  model.m_root.m_name._M_string_length = 2;
  model.m_root.m_name.field_2._M_local_buf[2] = '\0';
  model.m_root.m_name._M_dataplus._M_p = (pointer)paVar2;
  Args::CmdLine::value((String *)&d,(CmdLine *)&out,(String *)&model);
  local_810.field_2._M_local_buf[0] = '-';
  local_810.field_2._M_local_buf[1] = 'o';
  local_810._M_string_length = 2;
  local_810.field_2._M_local_buf[2] = '\0';
  local_810._M_dataplus._M_p = (pointer)paVar1;
  Args::CmdLine::value(&local_830,(CmdLine *)&out,&local_810);
  for_generation_t::for_generation_t((for_generation_t *)&in,(string *)&d,&local_830);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p,
                    CONCAT71(local_830.field_2._M_allocated_capacity._1_7_,
                             local_830.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != paVar1) {
    operator_delete(local_810._M_dataplus._M_p,
                    CONCAT53(local_810.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_810.field_2._M_local_buf[2],
                                      CONCAT11(local_810.field_2._M_local_buf[1],
                                               local_810.field_2._M_local_buf[0]))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)d.m_stream != local_6c0) {
    operator_delete(d.m_stream,
                    CONCAT17(local_6c0[0]._M_local_buf[7],
                             (undefined7)local_6c0[0]._M_allocated_capacity) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)model.m_root.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(model.m_root.m_name._M_dataplus._M_p,
                    CONCAT53(model.m_root.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(model.m_root.m_name.field_2._M_local_buf[2],
                                      CONCAT11(model.m_root.m_name.field_2._M_local_buf[1],
                                               model.m_root.m_name.field_2._M_local_buf[0]))) + 1);
  }
  if (local_230 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please specify input file.",0x1a);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else if (local_210 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please specify output file.",0x1b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    Args::CmdLine::~CmdLine((CmdLine *)&out);
    for_generation_t::operator=(&data,(for_generation_t *)&in);
    for_generation_t::~for_generation_t((for_generation_t *)&in);
    std::ifstream::ifstream(&in,(string *)&data,_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(_in + -0x18)) == 0) {
      cfgfile::generator::cfg::model_t::model_t(&model);
      cfgfile::generator::cfg::tag_model_t::tag_model_t((tag_model_t *)&out);
      d.m_stream = (istream_t *)&in;
      fVar4 = cfgfile::details::determine_format_t<cfgfile::string_trait_t>::format(&d);
      std::istream::seekg(&in,0,0);
      if (fVar4 == cfgfile_format) {
        cfgfile::input_stream_t<cfgfile::string_trait_t>::input_stream_t
                  ((input_stream_t<cfgfile::string_trait_t> *)&d,&data.m_input_file_name,
                   (istream_t *)&in);
        cfgfile::parser_t<cfgfile::string_trait_t>::parser_t
                  ((parser_t<cfgfile::string_trait_t> *)&local_830,
                   (tag_t<cfgfile::string_trait_t> *)&out,
                   (input_stream_t<cfgfile::string_trait_t> *)&d);
        (**(code **)(*(size_type *)local_830._M_dataplus._M_p + 0x10))
                  (local_830._M_dataplus._M_p,&data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_830._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_830._M_dataplus._M_p + 8))();
        }
        cfgfile::input_stream_t<cfgfile::string_trait_t>::~input_stream_t
                  ((input_stream_t<cfgfile::string_trait_t> *)&d);
      }
      else if (fVar4 == xml_format) {
        this = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7f0,"XML supported only with Qt. Parsing of file \"","");
        local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_810,local_7f0._M_dataplus._M_p,
                   local_7f0._M_dataplus._M_p + local_7f0._M_string_length);
        std::operator+(&local_830,&local_810,&data.m_input_file_name);
        local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
        local_7b0.field_2._M_allocated_capacity = 0x64656c6961662022;
        local_7b0.field_2._8_2_ = 0x2e;
        local_7b0._M_string_length = 9;
        __dnew = (size_type)&local_7c0;
        std::__cxx11::string::_M_construct<char*>();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                       &local_830,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew)
        ;
        cfgfile::exception_t<cfgfile::string_trait_t>::exception_t(this,(string_t *)&d);
        __cxa_throw(this,&cfgfile::exception_t<cfgfile::string_trait_t>::typeinfo,
                    cfgfile::exception_t<cfgfile::string_trait_t>::~exception_t);
      }
      std::ifstream::close();
      cfgfile::generator::cfg::tag_model_t::cfg((model_t *)&d,(tag_model_t *)&out);
      cfgfile::generator::cfg::model_t::operator=(&model,(model_t *)&d);
      cfgfile::generator::cfg::model_t::~model_t((model_t *)&d);
      cfgfile::generator::cfg::model_t::prepare(&model);
      cfgfile::generator::cfg::model_t::check(&model);
      cfgfile::generator::cfg::tag_model_t::~tag_model_t((tag_model_t *)&out);
      std::ofstream::ofstream(&out,(string *)&data.m_output_file_name,_S_out);
      iVar3 = *(int *)(((_func_int **)_out)[-3] + (long)(local_4c8 + 8));
      if (iVar3 == 0) {
        cfgfile::generator::cpp_generator_t::cpp_generator_t((cpp_generator_t *)&d,&model);
        cfgfile::generator::cpp_generator_t::generate((cpp_generator_t *)&d,(ostream *)&out);
        std::ofstream::close();
        cfgfile::generator::cpp_generator_t::~cpp_generator_t((cpp_generator_t *)&d);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Couldn\'t open output file for writting.",0x27);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
      }
      _out = _VTT;
      *(undefined8 *)(&out + (long)_VTT[-3]) = __filebuf;
      std::filebuf::~filebuf((filebuf *)&local_4d8);
      std::ios_base::~ios_base(local_3e8);
      cfgfile::generator::cfg::model_t::~model_t(&model);
      std::ifstream::~ifstream(&in);
      for_generation_t::~for_generation_t(&data);
      return (uint)(iVar3 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Specified input file doesn\'t exist.",0x23);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  exit(1);
}

Assistant:

int main( int argc, char ** argv )
{	
	for_generation_t data;

	try {
		data = parse_cli( argc, argv );
	}
	catch( const Args::HelpHasBeenPrintedException & )
	{
		return 0;
	}
	catch( const Args::BaseException & x )
	{
		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::ifstream in( data.input_file() );

	if( !in.good() )
	{
		std::cout << "Specified input file doesn't exist." << std::endl;

		exit( 1 );
	}

	cfgfile::generator::cfg::model_t model;

	try {
		cfgfile::generator::cfg::tag_model_t tag;

		cfgfile::read_cfgfile( tag, in, data.input_file() );

		in.close();

		model = tag.cfg();

		model.prepare();

		model.check();
	}
	catch( const cfgfile::exception_t< cfgfile::string_trait_t > & x )
	{
		in.close();

		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::ofstream out( data.output_file() );

	if( out.good() )
	{
		cfgfile::generator::cpp_generator_t gen( model );

		gen.generate( out );

		out.close();

		return 0;
	}
	else
	{
		std::cout << "Couldn't open output file for writting."
			<< std::endl;

		return 1;
	}
}